

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuid_tool.c
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  cpuid_raw_data_t raw;
  cpuid_data_t data;
  cpuid_raw_data_t local_7e0;
  cpuid_data_t local_1d0;
  
  icuid_opts.out = (char *)0x0;
  icuid_opts.dump = (char *)0x0;
  icuid_opts.data = (char *)0x0;
  icuid_opts.help = 0;
  icuid_opts._28_4_ = 0;
  iVar1 = options_parse(argc,argv,icuid_options,(char **)0x0);
  if (iVar1 == 0) {
    if (icuid_opts.help != 0) {
      main_cold_2();
      return 0;
    }
    out = _stdout;
    if ((icuid_opts.out == (char *)0x0) ||
       (out = (FILE *)fopen(icuid_opts.out,"w"), (FILE *)out != (FILE *)0x0)) {
      if (icuid_opts.dump == (char *)0x0) {
        if (icuid_opts.data == (char *)0x0) {
          iVar1 = cpuid_get_raw_data(&local_7e0);
        }
        else {
          iVar1 = cpuid_serialize_raw_data(&local_7e0,icuid_opts.data);
        }
        if (iVar1 == 0) {
          print_summary(&local_7e0,&local_1d0);
          if (icuid_opts.out != (char *)0x0) {
            fclose((FILE *)out);
            return 0;
          }
          return 0;
        }
      }
      else {
        iVar1 = cpuid_deserialize_raw_data(&local_7e0,icuid_opts.dump);
        if (iVar1 == 0) {
          return 0;
        }
      }
      __stream = out;
      pcVar2 = icuid_errorstr(iVar1);
      fprintf((FILE *)__stream,"%s\n",pcVar2);
    }
    else {
      main_cold_3();
    }
  }
  else {
    main_cold_1();
  }
  return -1;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = -1;
    cpuid_raw_data_t raw;
    cpuid_data_t data;

    memset(&icuid_opts, 0, sizeof(icuid_opts));

    if (options_parse(argc, argv, icuid_options, NULL) != 0) {
        usage();
        return -1;
    }

    if (icuid_opts.help) {
        usage();
        return 0;
    }

    out = stdout;
    if (icuid_opts.out != NULL) {
        if ((out = fopen(icuid_opts.out, "w")) == NULL) {
            fprintf(stderr, "Can't open file %s\n", icuid_opts.out);
            return -1;
        }
    }

    if (icuid_opts.dump != NULL) {
        ret = cpuid_deserialize_raw_data(&raw, icuid_opts.dump);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
        return 0;
    }

    if (icuid_opts.data != NULL) {
        ret = cpuid_serialize_raw_data(&raw, icuid_opts.data);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
    } else {
        ret = cpuid_get_raw_data(&raw);
        if (ret != ICUID_OK) {
            fprintf(out, "%s\n", icuid_errorstr(ret));
            return -1;
        }
    }

    ret = print_summary(&raw, &data);

    if (icuid_opts.out != NULL)
        fclose(out);

    return ret;
}